

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_nonce_agg
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *aggnonce,
              secp256k1_musig_pubnonce **pubnonces,size_t n_pubnonces)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_gej aggnonce_ptsj [2];
  secp256k1_ge aggnonce_pts [2];
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/session_impl.h"
            ,0x223,"test condition failed: ctx != NULL");
    abort();
  }
  if (aggnonce == (secp256k1_musig_aggnonce *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "aggnonce != NULL";
  }
  else if (pubnonces == (secp256k1_musig_pubnonce **)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "pubnonces != NULL";
  }
  else {
    if (n_pubnonces != 0) {
      iVar1 = secp256k1_musig_sum_pubnonces(ctx,aggnonce_ptsj,pubnonces,n_pubnonces);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_ge_set_all_gej_var(aggnonce_pts,aggnonce_ptsj,2);
      secp256k1_musig_aggnonce_save(aggnonce,aggnonce_pts);
      return 1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "n_pubnonces > 0";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_musig_nonce_agg(const secp256k1_context* ctx, secp256k1_musig_aggnonce  *aggnonce, const secp256k1_musig_pubnonce * const* pubnonces, size_t n_pubnonces) {
    secp256k1_gej aggnonce_ptsj[2];
    secp256k1_ge aggnonce_pts[2];
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(pubnonces != NULL);
    ARG_CHECK(n_pubnonces > 0);

    if (!secp256k1_musig_sum_pubnonces(ctx, aggnonce_ptsj, pubnonces, n_pubnonces)) {
        return 0;
    }
    secp256k1_ge_set_all_gej_var(aggnonce_pts, aggnonce_ptsj, 2);
    secp256k1_musig_aggnonce_save(aggnonce, aggnonce_pts);
    return 1;
}